

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> __thiscall
mjs::object::find(object *this,wstring_view key)

{
  wstring_view k;
  bool bVar1;
  gc_vector<mjs::object::property> *local_88;
  void *local_80;
  gc_vector<mjs::object::property> *local_78;
  property *local_70;
  object *local_68;
  size_t local_60;
  property *local_58;
  property *p;
  property *__end2;
  property *__begin2;
  gc_vector<mjs::object::property> *__range2;
  gc_vector<mjs::object::property> *props;
  object *this_local;
  wstring_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (object *)key._M_len;
  props = (gc_vector<mjs::object::property> *)this;
  __begin2 = (property *)
             gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                       (&this->properties_,this->heap_);
  __range2 = (gc_vector<mjs::object::property> *)__begin2;
  __end2 = gc_vector<mjs::object::property>::begin((gc_vector<mjs::object::property> *)__begin2);
  p = gc_vector<mjs::object::property>::end((gc_vector<mjs::object::property> *)__begin2);
  while( true ) {
    if (__end2 == p) {
      local_80 = (void *)0x0;
      local_88 = __range2;
      std::pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*>::
      pair<std::nullptr_t,_mjs::gc_vector<mjs::object::property>_*,_true>
                ((pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> *)
                 &key_local._M_str,&local_80,&local_88);
      return stack0xffffffffffffffe8;
    }
    local_58 = __end2;
    local_68 = this_local;
    local_60 = key_local._M_len;
    k._M_str = (wchar_t *)key_local._M_len;
    k._M_len = (size_t)this_local;
    bVar1 = property::key_matches(__end2,this->heap_,k);
    if (bVar1) break;
    __end2 = __end2 + 1;
  }
  local_70 = local_58;
  local_78 = __range2;
  std::pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*>::
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*,_true>
            ((pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> *)
             &key_local._M_str,&local_70,&local_78);
  return stack0xffffffffffffffe8;
}

Assistant:

std::pair<property*, gc_vector<property>*> find(const std::wstring_view key) const {
        auto& props = properties_.dereference(heap_);
        for (auto& p: props) {
            if (p.key_matches(heap_, key)) {
                return { &p, &props };
            }
        }
        return {nullptr, &props};
    }